

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue::~IfcPropertyBoundedValue
          (IfcPropertyBoundedValue *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 *puVar2;
  
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)&PTR__IfcPropertyBoundedValue_009237d8;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPropertyBoundedValue_00923850;
  *(undefined ***)&this[-1].field_0xc8 = &PTR__IfcPropertyBoundedValue_00923800;
  *(undefined ***)this = &PTR__IfcPropertyBoundedValue_00923828;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x48 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x48);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x30 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x30);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x18 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x18);
  }
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x923968;
  *(undefined8 *)&this->field_0x58 = 0x923990;
  puVar2 = *(undefined1 **)&this[-1].LowerBoundValue.have;
  p_Var1 = &this[-1].Unit.ptr.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)puVar2 != p_Var1) {
    operator_delete(puVar2,(ulong)((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1));
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>.
             field_0x18;
  if ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)puVar2 !=
      &this[-1].LowerBoundValue) {
    operator_delete(puVar2,(ulong)((long)&(this[-1].LowerBoundValue.ptr.
                                           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->_vptr_DataType + 1));
  }
  operator_delete(&this[-1].
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>.
                   aux_is_derived,0xd8);
  return;
}

Assistant:

IfcPropertyBoundedValue() : Object("IfcPropertyBoundedValue") {}